

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorcerer.c
# Opt level: O3

void grounding_end(CHAR_DATA *ch,AFFECT_DATA *af)

{
  byte *pbVar1;
  bool bVar2;
  
  bVar2 = str_cmp(race_table.super__Vector_base<race_type,_std::allocator<race_type>_>._M_impl.
                  super__Vector_impl_data._M_start[ch->race].name,"imp");
  if (bVar2) {
    bVar2 = str_cmp(race_table.super__Vector_base<race_type,_std::allocator<race_type>_>._M_impl.
                    super__Vector_impl_data._M_start[ch->race].name,"sidhe");
    if (bVar2) goto LAB_00310a40;
  }
  pbVar1 = (byte *)((long)ch->affected_by + 2);
  *pbVar1 = *pbVar1 | 8;
  send_to_char("As the magical grounding expires, you rise once more on your natural wings.\n\r",ch)
  ;
LAB_00310a40:
  bVar2 = is_affected(ch,(int)gsn_fly);
  if (bVar2) {
    pbVar1 = (byte *)((long)ch->affected_by + 2);
    *pbVar1 = *pbVar1 | 8;
    send_to_char("As the grounding expires, your fly spell regains its effectiveness.\n\r",ch);
    return;
  }
  return;
}

Assistant:

void grounding_end(CHAR_DATA *ch, AFFECT_DATA *af)
{
	if (!str_cmp(race_table[ch->race].name, "imp") || !str_cmp(race_table[ch->race].name, "sidhe"))
	{
		SET_BIT(ch->affected_by, AFF_FLYING);
		send_to_char("As the magical grounding expires, you rise once more on your natural wings.\n\r", ch);
	}

	if (is_affected(ch, gsn_fly))
	{
		SET_BIT(ch->affected_by, AFF_FLYING);
		send_to_char("As the grounding expires, your fly spell regains its effectiveness.\n\r", ch);
	}
}